

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O1

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  ulong uVar1;
  Curl_handler *pCVar2;
  dynbuf *pdVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  timediff_t tVar7;
  char *pcVar8;
  size_t sVar9;
  size_t size;
  h1_tunnel_state_conflict *phVar10;
  long lVar11;
  h1_tunnel_state_conflict *phVar12;
  bool bVar13;
  char byte;
  ssize_t nread;
  _Bool local_9a;
  char local_99;
  h1_tunnel_state_conflict *local_98;
  httpreq *local_90;
  int local_84;
  long local_80;
  size_t *local_78;
  char *local_70;
  dynbuf *local_68;
  connectdata *local_60;
  curl_socket_t local_54;
  size_t local_50;
  Curl_chunker *local_48;
  dynbuf *local_40;
  size_t local_38;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  phVar12 = (h1_tunnel_state_conflict *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect");
  }
  CVar5 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  if (phVar12 == (h1_tunnel_state_conflict *)0x0) {
    pCVar2 = cf->conn->handler;
    if ((pCVar2->flags & 0x4000) == 0) {
      CVar5 = Curl_get_upload_buffer(data);
      if (CVar5 == CURLE_OK) {
        phVar10 = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0x120);
        if (phVar10 == (h1_tunnel_state_conflict *)0x0) {
          CVar5 = CURLE_OUT_OF_MEMORY;
        }
        else {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"allocate connect buffer");
          }
          local_98 = (h1_tunnel_state_conflict *)&phVar10->rcvbuf;
          Curl_dyn_init((dynbuf *)local_98,0x4000);
          Curl_dyn_init(&phVar10->request_data,0x100000);
          Curl_httpchunk_init(data,&phVar10->ch,true);
          CVar5 = CURLE_OK;
          Curl_conncontrol(cf->conn,0);
          Curl_dyn_reset((dynbuf *)local_98);
          Curl_dyn_reset(&phVar10->request_data);
          phVar10->tunnel_state = H1_TUNNEL_INIT;
          phVar10->keepon = KEEPON_CONNECT;
          phVar10->cl = 0;
          phVar10->field_0x11c = phVar10->field_0x11c & 0xfd;
          phVar12 = phVar10;
        }
      }
    }
    else {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar2->scheme);
      CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
    }
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    cf->ctx = phVar12;
  }
  CVar5 = CURLE_OK;
  local_60 = cf->conn;
  if (phVar12 == (h1_tunnel_state_conflict *)0x0) {
LAB_00150660:
    local_40 = &phVar12->request_data;
    local_78 = &phVar12->nsent;
    local_68 = &phVar12->rcvbuf;
    local_48 = &phVar12->ch;
    local_80 = 3;
    local_98 = phVar12;
    do {
      tVar7 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar7 < 1) {
        bVar13 = false;
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        CVar5 = CURLE_OPERATION_TIMEDOUT;
        goto LAB_00150feb;
      }
      switch(phVar12->tunnel_state) {
      case H1_TUNNEL_INIT:
        if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"CONNECT start");
        }
        local_90 = (httpreq *)0x0;
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        CVar5 = Curl_http_proxy_create_CONNECT(&local_90,cf,data,1);
        if (CVar5 == CURLE_OK) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"Establish HTTP proxy tunnel to %s",local_90->authority);
          }
          pdVar3 = local_40;
          Curl_dyn_reset(local_40);
          *local_78 = 0;
          local_78[1] = 0;
          CVar5 = Curl_h1_req_write_head
                            (local_90,(uint)((cf->conn->http_proxy).proxytype != '\x01'),pdVar3);
        }
        if (CVar5 != CURLE_OK) {
          Curl_failf(data,"Failed sending CONNECT to proxy");
        }
        if (local_90 != (httpreq *)0x0) {
          Curl_http_req_free(local_90);
        }
        if (CVar5 == CURLE_OK) {
          h1_tunnel_go_state(cf,phVar12,H1_TUNNEL_CONNECT,data);
          goto switchD_001506d5_caseD_1;
        }
        break;
      case H1_TUNNEL_CONNECT:
switchD_001506d5_caseD_1:
        if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"CONNECT send");
        }
        pdVar3 = local_40;
        pcVar8 = Curl_dyn_ptr(local_40);
        sVar9 = Curl_dyn_len(pdVar3);
        local_90 = (httpreq *)((ulong)local_90 & 0xffffffff00000000);
        uVar1 = *local_78;
        if (uVar1 <= sVar9 && sVar9 - uVar1 != 0) {
          size = (*cf->next->cft->do_send)
                           (cf->next,data,pcVar8 + uVar1,sVar9 - uVar1,(CURLcode *)&local_90);
          if ((long)size < 0) {
            if ((CURLcode)local_90 == 0x51) {
              local_90 = (httpreq *)((ulong)local_90 & 0xffffffff00000000);
            }
          }
          else {
            *local_78 = *local_78 + size;
            Curl_debug(data,CURLINFO_HEADER_OUT,pcVar8 + uVar1,size);
          }
        }
        if ((CURLcode)local_90 != 0) {
          Curl_failf(data,"Failed sending CONNECT to proxy");
        }
        phVar12 = local_98;
        CVar5 = (CURLcode)local_90;
        if ((CURLcode)local_90 == CURLE_OK) {
          local_9a = sVar9 <= *local_78;
          if (local_9a) {
            h1_tunnel_go_state(cf,local_98,H1_TUNNEL_RECEIVE,data);
            goto switchD_001506d5_caseD_2;
          }
        }
        else {
          local_9a = false;
        }
        break;
      case H1_TUNNEL_RECEIVE:
switchD_001506d5_caseD_2:
        if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"CONNECT receive");
        }
        local_54 = Curl_conn_cf_get_socket(cf,data);
        local_9a = false;
        _Var4 = Curl_conn_data_pending(data,cf->sockindex);
        if (_Var4) {
          if (phVar12->keepon == KEEPON_DONE) {
            CVar5 = CURLE_OK;
          }
          else {
            local_84 = 0;
            do {
              CVar5 = Curl_read(data,local_54,&local_99,1,(ssize_t *)&local_90);
              lVar11 = 1;
              if ((CVar5 == CURLE_AGAIN) ||
                 (iVar6 = Curl_pgrsUpdate(data), phVar12 = local_98, iVar6 != 0)) goto LAB_001509c6;
              if (CVar5 != CURLE_OK) {
                local_98->keepon = KEEPON_DONE;
                CVar5 = (*(code *)((long)&DAT_0017b400 + (long)(int)(&DAT_0017b400)[local_80]))();
                return CVar5;
              }
              if ((long)local_90 < 1) {
                if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) ||
                   ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
                  Curl_failf(data,"Proxy CONNECT aborted");
                  local_84 = 1;
                }
                else {
                  local_98->field_0x11c = local_98->field_0x11c | 2;
                  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                    Curl_infof(data,"Proxy CONNECT connection closed");
                    phVar12->keepon = KEEPON_DONE;
                    CVar5 = (*(code *)((long)&DAT_0017b400 + (long)(int)(&DAT_0017b400)[local_80]))
                                      ();
                    return CVar5;
                  }
                }
                phVar12->keepon = KEEPON_DONE;
                CVar5 = (*(code *)((long)&DAT_0017b400 + (long)(int)(&DAT_0017b400)[local_80]))();
                return CVar5;
              }
              if (local_98->keepon == KEEPON_IGNORE) {
                lVar11 = local_98->cl;
                if (lVar11 == 0) {
                  if ((local_98->field_0x11c & 1) != 0) {
                    local_38 = 0;
                    CVar5 = Curl_httpchunk_read(data,local_48,&local_99,1,&local_38);
                    lVar11 = 1;
                    if (CVar5 == CURLE_OK) {
                      _Var4 = Curl_httpchunk_is_done(data,local_48);
                      lVar11 = 2;
                      if (_Var4) {
                        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                          Curl_infof(data,"chunk reading DONE");
                        }
                        local_98->keepon = KEEPON_DONE;
                      }
                    }
                    CVar5 = (*(code *)((long)&DAT_0017b400 + (long)(int)(&DAT_0017b400)[lVar11]))();
                    return CVar5;
                  }
                }
                else {
                  local_98->cl = lVar11 + -1;
                  if (lVar11 < 2) {
                    local_98->keepon = KEEPON_DONE;
                    CVar5 = (*(code *)((long)&DAT_0017b400 + (long)(int)(&DAT_0017b400)[local_80]))
                                      ();
                    return CVar5;
                  }
                }
                lVar11 = 2;
                goto LAB_001509c6;
              }
              CVar5 = Curl_dyn_addn(local_68,&local_99,1);
              pdVar3 = local_68;
              if (CVar5 != CURLE_OK) {
                Curl_failf(data,"CONNECT response too large");
                CVar5 = CURLE_RECV_ERROR;
                phVar12 = local_98;
                goto LAB_00150ebf;
              }
              if (local_99 != '\n') goto LAB_00150e30;
              local_98->headerlines = local_98->headerlines + 1;
              local_70 = Curl_dyn_ptr(local_68);
              local_50 = Curl_dyn_len(pdVar3);
              Curl_debug(data,CURLINFO_HEADER_IN,local_70,local_50);
              CVar5 = Curl_client_write(data,(uint)(local_98->headerlines == 1) * 8 + 0x14,local_70,
                                        local_50);
              if ((CVar5 != CURLE_OK) ||
                 (CVar5 = Curl_bump_headersize(data,local_50,true), CVar5 != CURLE_OK)) {
LAB_00150c3d:
                lVar11 = 1;
LAB_001509c6:
                CVar5 = (*(code *)((long)&DAT_0017b400 + (long)(int)(&DAT_0017b400)[lVar11]))();
                return CVar5;
              }
              if ((*local_70 != '\r') && (*local_70 != '\n')) {
                CVar5 = on_resp_header(cf,data,local_98,local_70);
                if (CVar5 == CURLE_OK) {
                  Curl_dyn_reset(local_68);
                  lVar11 = 0;
                  goto LAB_001509c6;
                }
                goto LAB_00150c3d;
              }
              if (((data->req).httpcode == 0x197) && (((data->state).field_0x74c & 0x20) == 0)) {
                local_98->keepon = KEEPON_IGNORE;
                if (local_98->cl == 0) {
                  if ((local_98->field_0x11c & 1) == 0) {
                    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
                        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
                       (0 < cf->cft->log_level)) {
                      Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                    }
                    local_98->keepon = KEEPON_DONE;
                  }
                  else {
                    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0))
                    goto LAB_00150e30;
                    Curl_infof(data,"Ignore chunked response-body");
                  }
                }
                else {
                  if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) {
LAB_00150e30:
                    lVar11 = 2;
                    goto LAB_001509c6;
                  }
                  Curl_infof(data,"Ignore %ld bytes of response-body");
                }
              }
              else {
                local_98->keepon = KEEPON_DONE;
              }
            } while (local_98->keepon != KEEPON_DONE);
            CVar5 = CURLE_OK;
            if (local_84 != 0) {
              CVar5 = CURLE_RECV_ERROR;
            }
          }
          phVar12 = local_98;
          local_9a = local_98->keepon == KEEPON_DONE;
          if (CVar5 == CURLE_OK && local_9a) {
            if ((data->info).httpproxycode - 200U < 100) goto LAB_00150ebd;
            CVar5 = Curl_http_auth_act(data);
          }
        }
        else {
LAB_00150ebd:
          CVar5 = CURLE_OK;
        }
LAB_00150ebf:
        iVar6 = Curl_pgrsUpdate(data);
        if (iVar6 == 0) {
          if (CVar5 == CURLE_OK) {
            bVar13 = false;
            if (local_9a != true) goto LAB_00150feb;
            h1_tunnel_go_state(cf,phVar12,H1_TUNNEL_RESPONSE,data);
            CVar5 = CURLE_OK;
            goto switchD_001506d5_caseD_3;
          }
        }
        else {
          CVar5 = CURLE_ABORTED_BY_CALLBACK;
        }
        break;
      case H1_TUNNEL_RESPONSE:
switchD_001506d5_caseD_3:
        if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"CONNECT response");
        }
        if ((data->req).newurl != (char *)0x0) {
          if (((phVar12->field_0x11c & 2) != 0) || (((uint)local_60->bits & 0x40) != 0)) {
            if (data != (Curl_easy *)0x0) {
              if (((cf != (Curl_cfilter *)0x0) &&
                  ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
                 (0 < cf->cft->log_level)) {
                Curl_trc_cf_infof(data,cf,"CONNECT need to close+open");
              }
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Connect me again please");
              }
            }
            Curl_conn_cf_close(cf,data);
            bVar13 = false;
            Curl_conncontrol(local_60,0);
            CVar5 = Curl_conn_cf_connect(cf->next,data,false,&local_9a);
            goto LAB_00150feb;
          }
          h1_tunnel_go_state(cf,phVar12,H1_TUNNEL_INIT,data);
        }
      default:
        bVar13 = true;
        goto LAB_00150feb;
      }
      bVar13 = false;
LAB_00150feb:
      if (!bVar13) goto LAB_001510a9;
    } while ((data->req).newurl != (char *)0x0);
    if ((data->info).httpproxycode - 200U < 100) {
      h1_tunnel_go_state(cf,phVar12,H1_TUNNEL_ESTABLISHED,data);
      CVar5 = CURLE_OK;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        CVar5 = CURLE_OK;
        Curl_infof(data,"CONNECT tunnel established, response %d",
                   (ulong)(uint)(data->info).httpproxycode);
      }
LAB_001510a9:
      if (CVar5 != CURLE_OK) {
        h1_tunnel_go_state(cf,phVar12,H1_TUNNEL_FAILED,data);
      }
      goto LAB_0015114e;
    }
    (*Curl_cfree)((void *)0x0);
    (data->req).newurl = (char *)0x0;
    Curl_conncontrol(local_60,2);
    h1_tunnel_go_state(cf,phVar12,H1_TUNNEL_FAILED,data);
    Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
  }
  else {
    if (phVar12->tunnel_state == H1_TUNNEL_ESTABLISHED) {
      CVar5 = CURLE_OK;
      goto LAB_0015114e;
    }
    if (phVar12->tunnel_state != H1_TUNNEL_FAILED) goto LAB_00150660;
  }
  CVar5 = CURLE_RECV_ERROR;
LAB_0015114e:
  if (CVar5 == CURLE_OK) {
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
    if (cf->ctx != (void *)0x0) {
      bVar13 = *(int *)((long)cf->ctx + 0x118) == 4;
      *done = bVar13;
      if (!bVar13) {
        return CURLE_OK;
      }
      cf->field_0x24 = cf->field_0x24 | 1;
      (data->req).bytecount = 0;
      *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xffdf | 1;
      Curl_client_cleanup(data);
      Curl_pgrsSetUploadCounter(data,0);
      Curl_pgrsSetDownloadCounter(data,0);
      tunnel_free(cf,data);
      return CURLE_OK;
    }
  }
  *done = false;
  return CVar5;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* TODO: can we do blocking? */
  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* Restore `data->req` fields that may habe been touched */
    data->req.header = TRUE; /* assume header */
    data->req.bytecount = 0;
    data->req.ignorebody = FALSE;
    Curl_client_cleanup(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}